

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Gia_Man_t * Gia_ManDupMuxes(Gia_Man_t *p,int Limit)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  uint uVar13;
  long lVar14;
  Gia_Obj_t *pGVar15;
  Gia_Obj_t *pGVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_48;
  Gia_Obj_t *local_40;
  int local_38;
  int local_34;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x67,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (Limit < 0) {
    __assert_fail("Limit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x68,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  iVar5 = p_00->nObjsAlloc;
  local_34 = Limit;
  puVar9 = (uint *)calloc((long)iVar5,4);
  p_00->pMuxes = puVar9;
  if (p->pSibls != (int *)0x0) {
    piVar10 = (int *)calloc((long)iVar5,4);
    p_00->pSibls = piVar10;
  }
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_00);
  if (1 < p->nObjs) {
    lVar14 = 0x100000000;
    lVar19 = 1;
    lVar18 = 0;
    do {
      pGVar2 = p->pObjs;
      uVar3 = *(ulong *)(&pGVar2[1].field_0x0 + lVar18);
      uVar4 = (uint)uVar3;
      if ((uVar4 & 0x9fffffff) == 0x9fffffff) {
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar3 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar3 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar3 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar15 = p_00->pObjs;
        if ((pGVar11 < pGVar15) || (pGVar15 + p_00->nObjs <= pGVar11)) {
LAB_0021cd45:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar15) >> 2) * -0x55555555);
        pGVar15 = p_00->pObjs;
        if ((pGVar11 < pGVar15) || (pGVar15 + p_00->nObjs <= pGVar11)) goto LAB_0021cd45;
        uVar4 = (int)((ulong)((long)pGVar11 - (long)pGVar15) >> 2) * 0x55555556;
      }
      else {
        iVar5 = (int)(uVar3 & 0x1fffffff);
        if ((uVar3 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar4) {
          if ((((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) ||
             ((uVar4 & 0x1fffffff) != ((uint)(uVar3 >> 0x20) & 0x1fffffff))) {
            pGVar15 = (Gia_Obj_t *)(&pGVar2[1].field_0x0 + lVar18);
            iVar5 = Gia_ObjIsMuxType(pGVar15);
            uVar3 = *(ulong *)pGVar15;
            uVar4 = (uint)(uVar3 >> 0x20);
            if ((iVar5 == 0) ||
               ((piVar10 = p->pSibls, piVar10 != (int *)0x0 &&
                ((*(int *)((long)piVar10 +
                          ((long)((ulong)((uint)uVar3 & 0x1fffffff) * -0x100000000 + lVar14) >> 0x1e
                          )) != 0 ||
                 (*(int *)((long)piVar10 +
                          ((long)((ulong)(uVar4 & 0x1fffffff) * -0x100000000 + lVar14) >> 0x1e)) !=
                  0)))))) {
              uVar13 = *(uint *)((long)pGVar2 +
                                lVar18 + (ulong)(((uint)uVar3 & 0x1fffffff) << 2) * -3 + 0x14);
              if (((int)uVar13 < 0) ||
                 (uVar17 = *(uint *)((long)pGVar2 +
                                    lVar18 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + 0x14
                                    ), (int)uVar17 < 0)) goto LAB_0021cda2;
              uVar4 = Gia_ManHashAnd(p_00,(uint)(uVar3 >> 0x1d) & 1 ^ uVar13,
                                     uVar17 ^ uVar4 >> 0x1d & 1);
            }
            else {
              iVar5 = Gia_ObjRecognizeExor(pGVar15,&local_40,&local_48);
              pGVar11 = p->pObjs;
              if (iVar5 == 0) {
                uVar4 = (uint)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar18) & 0x1fffffff;
                pGVar16 = (Gia_Obj_t *)((long)pGVar15 + (ulong)(uVar4 * 4) * -3);
                if ((pGVar16 < pGVar11) || (pGVar11 + p->nObjs <= pGVar16)) goto LAB_0021cd45;
                uVar13 = (uint)((ulong)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar18) >> 0x20) &
                         0x1fffffff;
                pGVar16 = (Gia_Obj_t *)((long)pGVar2 + lVar18 + (ulong)(uVar13 * 4) * -3 + 0xc);
                if ((pGVar16 < pGVar11) || (pGVar11 + p->nObjs <= pGVar16)) goto LAB_0021cd45;
                if (local_34 <
                    p->pRefs[(int)((long)pGVar2 +
                                   lVar18 + ((ulong)(uVar13 << 2) * -3 - (long)pGVar11) + 0xc >> 2)
                             * -0x55555555] +
                    p->pRefs[(int)((long)pGVar2 +
                                   lVar18 + ((ulong)(uVar4 << 2) * -3 - (long)pGVar11) + 0xc >> 2) *
                             -0x55555555]) {
                  iVar5 = Gia_ObjFanin0Copy(pGVar15);
                  iVar6 = Gia_ObjFanin1Copy(pGVar15);
                  uVar4 = Gia_ManHashAnd(p_00,iVar5,iVar6);
                }
                else {
                  pGVar15 = Gia_ObjRecognizeMux(pGVar15,&local_48,&local_40);
                  iVar5 = Gia_ObjToLit(p,pGVar15);
                  iVar5 = Gia_ObjLitCopy(p,iVar5);
                  iVar6 = Gia_ObjToLit(p,local_48);
                  local_38 = Gia_ObjLitCopy(p,iVar6);
                  iVar6 = Gia_ObjToLit(p,local_40);
                  iVar6 = Gia_ObjLitCopy(p,iVar6);
                  uVar4 = Gia_ManHashMuxReal(p_00,iVar5,local_38,iVar6);
                }
              }
              else {
                pGVar15 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
                if (pGVar15 < pGVar11) goto LAB_0021cd45;
                uVar4 = p->nObjs;
                if (pGVar11 + (int)uVar4 <= pGVar15) goto LAB_0021cd45;
                uVar13 = (int)((long)pGVar15 - (long)pGVar11 >> 2) * -0x55555555;
                if ((int)uVar13 < 0) {
LAB_0021cdff:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                if ((int)uVar4 <= (int)uVar13) goto LAB_0021cd64;
                if ((int)pGVar11[uVar13 & 0x7fffffff].Value < 0) goto LAB_0021cda2;
                pGVar15 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
                if ((pGVar15 < pGVar11) || (pGVar11 + (int)uVar4 <= pGVar15)) goto LAB_0021cd45;
                uVar17 = (int)((long)pGVar15 - (long)pGVar11 >> 2) * -0x55555555;
                if ((int)uVar17 < 0) goto LAB_0021cdff;
                if (uVar4 <= uVar17) goto LAB_0021cd64;
                if ((int)pGVar11[uVar17 & 0x7fffffff].Value < 0) goto LAB_0021cda2;
                uVar4 = Gia_ManHashXorReal(p_00,pGVar11[uVar13 & 0x7fffffff].Value ^
                                                (uint)local_40 & 1,
                                           pGVar11[uVar17 & 0x7fffffff].Value ^ (uint)local_48 & 1);
              }
            }
          }
          else {
            uVar13 = *(uint *)((long)pGVar2 + lVar18 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
            if ((int)uVar13 < 0) goto LAB_0021cda2;
            uVar4 = Gia_ManAppendBuf(p_00,uVar13 ^ uVar4 >> 0x1d & 1);
          }
        }
        else {
          uVar13 = *(uint *)((long)pGVar2 + lVar18 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
          if ((int)uVar13 < 0) {
LAB_0021cda2:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = Gia_ManAppendCo(p_00,uVar13 ^ uVar4 >> 0x1d & 1);
        }
      }
      *(uint *)((long)&pGVar2[1].Value + lVar18) = uVar4;
      if (p->pSibls != (int *)0x0) {
        uVar13 = p->pSibls[lVar19];
        if ((ulong)uVar13 != 0) {
          if ((int)uVar4 < 0) {
LAB_0021cd83:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar4 = uVar4 >> 1;
          if (((p_00->nObjs <= (int)uVar4) || ((int)uVar13 < 0)) || (p->nObjs <= (int)uVar13)) {
LAB_0021cd64:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar13 = p->pObjs[uVar13].Value;
          if ((int)uVar13 < 0) goto LAB_0021cd83;
          uVar13 = uVar13 >> 1;
          if ((uint)p_00->nObjs <= uVar13) goto LAB_0021cd64;
          uVar17 = *(uint *)(p_00->pObjs + uVar4);
          if ((((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) &&
              (uVar17 = (uint)*(undefined8 *)(p_00->pObjs + uVar13), -1 < (int)uVar17)) &&
             (((uVar17 & 0x1fffffff) != 0x1fffffff && (uVar13 < uVar4)))) {
            p_00->pSibls[uVar4] = uVar13;
          }
        }
      }
      lVar19 = lVar19 + 1;
      lVar14 = lVar14 + 0x100000000;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxes( Gia_Man_t * p, int Limit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC, * pSiblNew, * pObjNew;
    int i;
    assert( p->pMuxes == NULL );
    assert( Limit >= 0 ); // allows to create AIG with XORs without MUXes
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !Gia_ObjIsMuxType(pObj) || Gia_ObjSibl(p, Gia_ObjFaninId0(pObj, i)) || Gia_ObjSibl(p, Gia_ObjFaninId1(pObj, i)) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)) );
        else if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) + Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > Limit )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
        if ( !Gia_ObjSibl(p, i) )
            continue;
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        pSiblNew = Gia_ManObj( pNew, Abc_Lit2Var(Gia_ObjSiblObj(p, i)->Value) );
        if ( Gia_ObjIsAnd(pObjNew) && Gia_ObjIsAnd(pSiblNew) && Gia_ObjId(pNew, pObjNew) > Gia_ObjId(pNew, pSiblNew) )
            pNew->pSibls[Gia_ObjId(pNew, pObjNew)] = Gia_ObjId(pNew, pSiblNew);
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}